

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::HairSetNode::HairSetNode
          (HairSetNode *this,RTCGeometryType type,Ref<embree::SceneGraph::MaterialNode> *material,
          BBox1f time_range,size_t numTimeSteps)

{
  ulong in_RCX;
  long *in_RDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  size_t i;
  size_t i_2;
  size_t i_1;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  Node *in_stack_fffffffffffffeb0;
  undefined1 local_e0 [8];
  ulong local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  ulong local_c0;
  ulong local_a8;
  undefined4 local_94;
  undefined8 local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  long *local_60;
  ulong local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined1 *local_20;
  
  local_a8 = in_RCX;
  local_94 = in_ESI;
  local_88 = in_XMM0_Qa;
  Node::Node(in_stack_fffffffffffffeb0,(bool)in_stack_fffffffffffffeaf);
  *in_RDI = &PTR__HairSetNode_005ff568;
  in_RDI[0xd] = local_88;
  *(undefined4 *)(in_RDI + 0xe) = local_94;
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            *)0x1eb8a2);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x1eb8b8);
  std::
  vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            *)0x1eb8ce);
  std::
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ::vector((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *)0x1eb8e4);
  std::
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  ::vector((vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
            *)0x1eb8fa);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1eb910);
  local_60 = in_RDI + 0x21;
  *local_60 = *in_RDX;
  if (*local_60 != 0) {
    (**(code **)(*(long *)*local_60 + 0x10))();
  }
  *(undefined4 *)(in_RDI + 0x22) = 4;
  for (local_c0 = 0; local_c0 < local_a8; local_c0 = local_c0 + 1) {
    local_80 = local_e0;
    local_d8 = 0;
    local_d0 = 0;
    local_c8 = 0;
    std::
    vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
    ::push_back((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                 *)in_stack_fffffffffffffeb0,
                (value_type *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    local_78 = local_e0;
    for (local_40 = 0; local_40 < local_d8; local_40 = local_40 + 1) {
    }
    local_30 = local_d0;
    local_28 = local_c8;
    local_38 = local_78;
    local_20 = local_78;
    alignedFree((void *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  }
  return;
}

Assistant:

HairSetNode (RTCGeometryType type, Ref<MaterialNode> material, const BBox1f time_range = BBox1f(0,1), size_t numTimeSteps = 0)
        : Node(true), time_range(time_range), type(type), material(material), tessellation_rate(4)
      {
        for (size_t i=0; i<numTimeSteps; i++)
          positions.push_back(avector<Vertex>());
      }